

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O3

int If_CutSopBalancePinDelaysIntInt(Vec_Int_t *vCover,int *pTimes,int nSuppAll,char *pPerm)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  word Res;
  word FaninRes [15];
  ulong local_a0;
  word local_98 [16];
  
  if (nSuppAll < 1) {
    iVar1 = If_CutSopBalancePinDelaysInt(vCover,pTimes,local_98,nSuppAll,&local_a0);
  }
  else {
    lVar2 = 0;
    do {
      if (lVar2 == 0x40) {
        __assert_fail("v >= 0 && v < 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCount.h"
                      ,0x92,"word If_CutPinDelayInit(int)");
      }
      *(long *)((long)local_98 + lVar2 * 2) = 1L << ((byte)lVar2 & 0x3f);
      lVar2 = lVar2 + 4;
    } while ((ulong)(uint)nSuppAll * 4 - lVar2 != 0);
    iVar1 = If_CutSopBalancePinDelaysInt(vCover,pTimes,local_98,nSuppAll,&local_a0);
    if (0 < nSuppAll) {
      lVar2 = 0;
      do {
        if (lVar2 == 0x40) {
          __assert_fail("v >= 0 && v < 16",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCount.h"
                        ,0x90,"int If_CutPinDelayGet(word, int)");
        }
        uVar3 = (uint)(local_a0 >> ((byte)lVar2 & 0x3f)) & 0xf;
        if (uVar3 < 2) {
          __assert_fail("Delay > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCount.h"
                        ,0xbb,"void If_CutPinDelayTranslate(word, int, char *)");
        }
        *pPerm = (char)uVar3 + -1;
        lVar2 = lVar2 + 4;
        pPerm = pPerm + 1;
      } while ((ulong)(uint)nSuppAll << 2 != lVar2);
    }
  }
  return iVar1;
}

Assistant:

int If_CutSopBalancePinDelaysIntInt( Vec_Int_t * vCover, int * pTimes, int nSuppAll, char * pPerm )
{
    int i, Delay;
    word Res, FaninRes[IF_MAX_FUNC_LUTSIZE];
    for ( i = 0; i < nSuppAll; i++ )
        FaninRes[i] = If_CutPinDelayInit(i);
    Delay = If_CutSopBalancePinDelaysInt( vCover, pTimes, FaninRes, nSuppAll, &Res );
    If_CutPinDelayTranslate( Res, nSuppAll, pPerm );
    return Delay;
}